

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pass2.cpp
# Opt level: O2

string * __thiscall
cs222::Pass2::calculateDisp_abi_cxx11_
          (string *__return_storage_ptr__,Pass2 *this,int address,Instruction *instruction,
          char *flags)

{
  ulong uVar1;
  char hexValue;
  size_t sVar2;
  int iVar3;
  uint dec;
  Pass2 *pPVar4;
  int i;
  long lVar5;
  string binaryString;
  string local_90;
  string local_70;
  string local_50;
  
  pPVar4 = this;
  sVar2 = Instruction::getAddress(instruction);
  iVar3 = address - (int)sVar2;
  if (iVar3 - 0x803U < 0xfffff000) {
    flags[3] = '1';
    flags[4] = '0';
    dec = address - this->base;
    if (0x1000 < dec) {
      std::__cxx11::string::assign((char *)&this->errorReportMessage);
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&binaryString);
      return __return_storage_ptr__;
    }
  }
  else {
    dec = iVar3 - 3;
  }
  decimalToHex_abi_cxx11_(__return_storage_ptr__,pPVar4,dec);
  uVar1 = __return_storage_ptr__->_M_string_length;
  if (uVar1 < 4) {
    if (uVar1 != 3) {
      std::__cxx11::string::insert((ulong)__return_storage_ptr__,0,'\x03' - (char)uVar1);
    }
  }
  else {
    std::__cxx11::string::substr((ulong)&binaryString,(ulong)__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&binaryString);
    std::__cxx11::string::~string((string *)&binaryString);
  }
  std::operator+(&binaryString,"DISPLACEMENT: ",__return_storage_ptr__);
  logDebug(&binaryString);
  std::__cxx11::string::~string((string *)&binaryString);
  Instruction::getOperation_abi_cxx11_(&local_90,instruction);
  hexValue = getOpcode(&local_90);
  charToBinStr_abi_cxx11_(&binaryString,(Pass2 *)instruction,hexValue);
  std::__cxx11::string::~string((string *)&local_90);
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    std::operator+(&local_90,&binaryString,flags[lVar5]);
    std::__cxx11::string::operator=((string *)&binaryString,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
  }
  pPVar4 = (Pass2 *)&binaryString;
  std::__cxx11::string::string((string *)&local_70,(string *)pPVar4);
  binaryToHex(&local_50,pPVar4,&local_70);
  std::operator+(&local_90,&local_50,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&binaryString);
  return __return_storage_ptr__;
}

Assistant:

std::string Pass2::calculateDisp(int address,Instruction &instruction, char flags[6])
    {
        int disp = address - (instruction.getAddress()+3);
        if (disp > 2047 || disp < -2048)
        {
            //use base relative
            if (base != INT_MIN)
            {
                flags[3] = '1';
                flags[4] = '0';
                disp = address - base;
                if (disp < 0 || disp > 4096)
                {
                    errorReportMessage = "Disp is out of range";
                    return "";
                }

            }else
            {
                errorReportMessage = "Base register is empty!!";
                return "";
            }
        }
        std::string objCode = decimalToHex(disp);
        if (objCode.length() > 3) objCode = objCode.substr(objCode.length() - 3,3);
        else if (objCode.length() < 3) objCode.insert(0,3-objCode.size(),'0');
        logDebug("DISPLACEMENT: " + objCode);

        std::string binaryString = charToBinStr(getOpcode(instruction.getOperation()));
        for (int i = 0; i < 6; ++i) {
            binaryString = binaryString + flags[i];
        }
        objCode = binaryToHex(binaryString) + objCode;
        return objCode;
    }